

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

bool HasDefaultConstructor(ExpressionContext *ctx,SynBase *source,TypeBase *type)

{
  FunctionData *function;
  IntrusiveList<TypeHandle> generics;
  ArrayView<ArgumentData> arguments_00;
  bool bVar1;
  uint uVar2;
  FunctionData **ppFVar3;
  ExprBase *context;
  bool_type bVar4;
  ArrayView<FunctionValue> functions_00;
  ArrayView<ArgumentData> local_b90;
  IntrusiveList<TypeHandle> local_b80;
  undefined1 local_b70 [12];
  undefined1 local_b60 [8];
  FunctionValue bestOverload;
  SmallArray<ArgumentData,_32U> arguments;
  SmallArray<unsigned_int,_32U> ratings;
  FunctionData *curr;
  undefined1 local_470 [4];
  uint i;
  SmallArray<FunctionValue,_32U> overloads;
  undefined1 local_148 [8];
  SmallArray<FunctionData_*,_32U> functions;
  TypeArray *arrType;
  TypeBase *type_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  arrType = (TypeArray *)type;
  while (functions.allocator = (Allocator *)getType<TypeArray>(&arrType->super_TypeBase),
        (TypeArray *)functions.allocator != (TypeArray *)0x0) {
    arrType = (TypeArray *)((TypeArray *)functions.allocator)->subType;
  }
  SmallArray<FunctionData_*,_32U>::SmallArray
            ((SmallArray<FunctionData_*,_32U> *)local_148,ctx->allocator);
  bVar1 = GetTypeConstructorFunctions
                    (ctx,&arrType->super_TypeBase,true,(SmallArray<FunctionData_*,_32U> *)local_148)
  ;
  if (bVar1) {
    SmallArray<FunctionValue,_32U>::SmallArray
              ((SmallArray<FunctionValue,_32U> *)local_470,ctx->allocator);
    for (curr._4_4_ = 0;
        uVar2 = SmallArray<FunctionData_*,_32U>::size((SmallArray<FunctionData_*,_32U> *)local_148),
        curr._4_4_ < uVar2; curr._4_4_ = curr._4_4_ + 1) {
      ppFVar3 = SmallArray<FunctionData_*,_32U>::operator[]
                          ((SmallArray<FunctionData_*,_32U> *)local_148,curr._4_4_);
      function = *ppFVar3;
      context = &ExpressionContext::get<ExprNullptrLiteral>(ctx)->super_ExprBase;
      ExprNullptrLiteral::ExprNullptrLiteral
                ((ExprNullptrLiteral *)context,source,function->contextType);
      FunctionValue::FunctionValue((FunctionValue *)&ratings.allocator,source,function,context);
      SmallArray<FunctionValue,_32U>::push_back
                ((SmallArray<FunctionValue,_32U> *)local_470,(FunctionValue *)&ratings.allocator);
    }
    SmallArray<unsigned_int,_32U>::SmallArray
              ((SmallArray<unsigned_int,_32U> *)&arguments.allocator,ctx->allocator);
    SmallArray<ArgumentData,_32U>::SmallArray
              ((SmallArray<ArgumentData,_32U> *)&bestOverload.context,ctx->allocator);
    ArrayView<FunctionValue>::ArrayView<32u>
              ((ArrayView<FunctionValue> *)local_b70,(SmallArray<FunctionValue,_32U> *)local_470);
    IntrusiveList<TypeHandle>::IntrusiveList(&local_b80);
    ArrayView<ArgumentData>::ArrayView<32u>
              (&local_b90,(SmallArray<ArgumentData,_32U> *)&bestOverload.context);
    generics.tail = local_b80.tail;
    generics.head = local_b80.head;
    arguments_00.count = local_b90.count;
    arguments_00._12_4_ = local_b90._12_4_;
    arguments_00.data = local_b90.data;
    functions_00._12_4_ = 0;
    functions_00.data = (FunctionValue *)local_b70._0_8_;
    functions_00.count = local_b70._8_4_;
    SelectBestFunction((FunctionValue *)local_b60,ctx,source,functions_00,generics,arguments_00,
                       (SmallArray<unsigned_int,_32U> *)&arguments.allocator);
    bVar4 = FunctionValue::operator_cast_to_function_pointer((FunctionValue *)local_b60);
    ctx_local._7_1_ = bVar4 != 0;
    SmallArray<ArgumentData,_32U>::~SmallArray
              ((SmallArray<ArgumentData,_32U> *)&bestOverload.context);
    SmallArray<unsigned_int,_32U>::~SmallArray
              ((SmallArray<unsigned_int,_32U> *)&arguments.allocator);
    SmallArray<FunctionValue,_32U>::~SmallArray((SmallArray<FunctionValue,_32U> *)local_470);
  }
  else {
    ctx_local._7_1_ = false;
  }
  SmallArray<FunctionData_*,_32U>::~SmallArray((SmallArray<FunctionData_*,_32U> *)local_148);
  return ctx_local._7_1_;
}

Assistant:

bool HasDefaultConstructor(ExpressionContext &ctx, SynBase *source, TypeBase *type)
{
	// Find array element type
	while(TypeArray *arrType = getType<TypeArray>(type))
		type = arrType->subType;

	SmallArray<FunctionData*, 32> functions(ctx.allocator);

	if(GetTypeConstructorFunctions(ctx, type, true, functions))
	{
		SmallArray<FunctionValue, 32> overloads(ctx.allocator);

		for(unsigned i = 0; i < functions.size(); i++)
		{
			FunctionData *curr = functions[i];

			overloads.push_back(FunctionValue(source, curr, new (ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(source, curr->contextType)));
		}

		SmallArray<unsigned, 32> ratings(ctx.allocator);
		SmallArray<ArgumentData, 32> arguments(ctx.allocator);

		if(FunctionValue bestOverload = SelectBestFunction(ctx, source, overloads, IntrusiveList<TypeHandle>(), arguments, ratings))
			return true;

		return false;
	}

	return false;
}